

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDU_Factory.cpp
# Opt level: O0

void __thiscall KDIS::UTILS::PDU_Factory::~PDU_Factory(PDU_Factory *this)

{
  bool bVar1;
  reference ppPVar2;
  __normal_iterator<KDIS::UTILS::PDU_Factory_Filter_**,_std::vector<KDIS::UTILS::PDU_Factory_Filter_*,_std::allocator<KDIS::UTILS::PDU_Factory_Filter_*>_>_>
  local_20;
  iterator itrEnd;
  iterator itr;
  PDU_Factory *this_local;
  
  this->_vptr_PDU_Factory = (_func_int **)&PTR_Decode_00336398;
  itrEnd = std::
           vector<KDIS::UTILS::PDU_Factory_Filter_*,_std::allocator<KDIS::UTILS::PDU_Factory_Filter_*>_>
           ::begin(&this->m_vFilters);
  local_20._M_current =
       (PDU_Factory_Filter **)
       std::
       vector<KDIS::UTILS::PDU_Factory_Filter_*,_std::allocator<KDIS::UTILS::PDU_Factory_Filter_*>_>
       ::end(&this->m_vFilters);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&itrEnd,&local_20);
    if (!bVar1) break;
    ppPVar2 = __gnu_cxx::
              __normal_iterator<KDIS::UTILS::PDU_Factory_Filter_**,_std::vector<KDIS::UTILS::PDU_Factory_Filter_*,_std::allocator<KDIS::UTILS::PDU_Factory_Filter_*>_>_>
              ::operator*(&itrEnd);
    if (*ppPVar2 != (PDU_Factory_Filter *)0x0) {
      (**(code **)(*(long *)*ppPVar2 + 8))();
    }
    __gnu_cxx::
    __normal_iterator<KDIS::UTILS::PDU_Factory_Filter_**,_std::vector<KDIS::UTILS::PDU_Factory_Filter_*,_std::allocator<KDIS::UTILS::PDU_Factory_Filter_*>_>_>
    ::operator++(&itrEnd);
  }
  std::vector<KDIS::UTILS::PDU_Factory_Filter_*,_std::allocator<KDIS::UTILS::PDU_Factory_Filter_*>_>
  ::~vector(&this->m_vFilters);
  return;
}

Assistant:

PDU_Factory::~PDU_Factory()
{
    // Delete the filters
    vector<PDU_Factory_Filter*>::iterator itr = m_vFilters.begin();
    vector<PDU_Factory_Filter*>::iterator itrEnd = m_vFilters.end();
    for( ; itr != itrEnd; ++itr )
    {
        delete *itr;
    }
}